

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCodingTests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cbf::BinaryCodingTests_basic_Test::BinaryCodingTests_basic_Test
          (BinaryCodingTests_basic_Test *this)

{
  BinaryCodingTests_basic_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__BinaryCodingTests_basic_Test_002ff3e8;
  return;
}

Assistant:

TEST(BinaryCodingTests, basic) {
  // Check the coding of basic types.
  checkRoundtrip(bool(false));
  checkRoundtrip(bool(true));
  checkRoundtrip(uint8_t(0xAB));
  checkRoundtrip(uint16_t(0xABCD));
  checkRoundtrip(uint32_t(0xABCD0123));
  checkRoundtrip(uint64_t(0xABCD01234567DCBAULL));
  checkRoundtrip(std::string("hello"));
}